

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getmemberhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  bool bVar1;
  SQObjectPtr *key;
  SQRESULT SVar2;
  SQObjectPtr val;
  SQObjectPtr *o;
  SQObject local_38;
  SQObjectPtr *local_20;
  
  local_20 = (SQObjectPtr *)0x0;
  bVar1 = sq_aux_gettypedarg(v,idx,OT_CLASS,&local_20);
  SVar2 = -1;
  if (bVar1) {
    key = SQVM::GetUp(v,-1);
    local_38._unVal.pTable = (SQTable *)0x0;
    local_38._type = OT_NULL;
    local_38._flags = '\0';
    local_38._5_3_ = 0;
    bVar1 = SQTable::Get(((local_20->super_SQObject)._unVal.pDelegable)->_delegate,key,
                         (SQObjectPtr *)&local_38);
    if (bVar1) {
      handle->_static = (ulong)((local_38._unVal._0_4_ >> 0x16 & 1) == 0);
      handle->_index = (ulong)(local_38._unVal._0_4_ & 0x3fffff);
      SQVM::Pop(v);
      SVar2 = 0;
    }
    else {
      SVar2 = -1;
      sq_throwerror(v,"wrong index");
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_38);
  }
  return SVar2;
}

Assistant:

SQRESULT sq_getmemberhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-1);
    SQTable *m = _class(*o)->_members;
    SQObjectPtr val;
    if(m->Get(key,val)) {
        handle->_static = _isfield(val) ? SQFalse : SQTrue;
        handle->_index = _member_idx(val);
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}